

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

ParseError *
jaegertracing::net::http::ParseError::make
          (ParseError *__return_storage_ptr__,string *expected,string *actual)

{
  ostream *poVar1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream oss;
  string *actual_local;
  string *expected_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Parse error, expected ");
  poVar1 = std::operator<<(poVar1,(string *)expected);
  poVar1 = std::operator<<(poVar1,", encountered \"");
  poVar1 = std::operator<<(poVar1,(string *)actual);
  std::operator<<(poVar1,'\"');
  std::__cxx11::ostringstream::str();
  invalid_argument(__return_storage_ptr__,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

static ParseError make(const std::string& expected,
                           const std::string& actual)
    {
        std::ostringstream oss;
        oss << "Parse error, expected " << expected << ", encountered \""
            << actual << '"';
        return ParseError(oss.str());
    }